

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_control.hpp
# Opt level: O2

bool boost::xpressive::detail::
     pop_context_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *state)

{
  match_context *context;
  int iVar1;
  
  context = (state->context_).prev_context_;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap_context(state,context);
  iVar1 = (*context->next_ptr_->_vptr_matchable[2])(context->next_ptr_,state);
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap_context(state,context);
  return SUB41(iVar1,0);
}

Assistant:

inline bool pop_context_match(match_state<BidiIter> &state)
{
    // save state
    // BUGBUG nested regex could have changed state.traits_
    match_context<BidiIter> &context(*state.context_.prev_context_);
    state.swap_context(context);

    // Finished matching the nested regex; now match the rest of the enclosing regex
    bool success = context.next_ptr_->match(state);

    // restore state
    state.swap_context(context);
    return success;
}